

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O3

Value * __thiscall Json::Value::append(Value *this,Value *value)

{
  ushort uVar1;
  ValueHolder VVar2;
  ValueHolder VVar3;
  ValueHolder VVar4;
  ArrayIndex index;
  ValueHolder *pVVar5;
  ValueHolder local_30;
  ushort local_28;
  ValueHolder local_18;
  ValueHolder VStack_10;
  
  Value((Value *)&local_30,value);
  index = size(this);
  pVVar5 = &operator[](this,index)->value_;
  uVar1 = *(ushort *)(pVVar5 + 1);
  VVar2 = *pVVar5;
  *pVVar5 = local_30;
  *(ushort *)(pVVar5 + 1) = local_28 & 0x1ff | uVar1 & 0xfe00;
  local_28 = uVar1 & 0x1ff | local_28 & 0xfe00;
  VVar3 = pVVar5[3];
  VVar4 = pVVar5[4];
  pVVar5[3] = local_18;
  pVVar5[4] = VStack_10;
  local_30 = VVar2;
  local_18 = VVar3;
  VStack_10 = VVar4;
  ~Value((Value *)&local_30);
  return (Value *)pVVar5;
}

Assistant:

Value& Value::append(const Value& value) { return (*this)[size()] = value; }